

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O2

LocalizedNumberFormatter * __thiscall
icu_63::number::NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>::adoptUnit
          (LocalizedNumberFormatter *__return_storage_ptr__,
          NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter> *this,MeasureUnit *unit)

{
  LocalizedNumberFormatter::LocalizedNumberFormatter(__return_storage_ptr__,this);
  if (unit != (MeasureUnit *)0x0) {
    MeasureUnit::operator=
              (&(__return_storage_ptr__->
                super_NumberFormatterSettings<icu_63::number::LocalizedNumberFormatter>).fMacros.
                unit,unit);
    (*(unit->super_UObject)._vptr_UObject[1])(unit);
  }
  return __return_storage_ptr__;
}

Assistant:

Derived NumberFormatterSettings<Derived>::adoptUnit(icu::MeasureUnit* unit)&& {
    Derived move(std::move(*this));
    // See comments above about slicing and ownership.
    if (unit != nullptr) {
        // TODO: On nullptr, reset to default value?
        move.fMacros.unit = std::move(*unit);
        delete unit;
    }
    return move;
}